

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_cab.c
# Opt level: O0

wchar_t cab_read_header(archive_read *a)

{
  long lVar1;
  uint16_t uVar2;
  wchar_t wVar3;
  uint32_t uVar4;
  void *pvVar5;
  ssize_t sVar6;
  long lVar7;
  uint *n;
  time_t tVar8;
  uchar *p_00;
  archive *in_RDI;
  ssize_t avail;
  cffile *file;
  cffolder *folder;
  uint16_t cfheader;
  uint32_t offset32;
  wchar_t prev_folder;
  wchar_t cur_folder;
  wchar_t i;
  wchar_t err;
  int64_t skip;
  ssize_t len;
  size_t used;
  size_t bytes;
  cfheader *hd;
  cab *cab;
  uchar *p;
  ssize_t *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  uint in_stack_ffffffffffffff84;
  archive_read *in_stack_ffffffffffffff88;
  uint *in_stack_ffffffffffffff98;
  undefined2 in_stack_ffffffffffffffa0;
  uint16_t in_stack_ffffffffffffffa2;
  uint uVar9;
  undefined4 in_stack_ffffffffffffffa8;
  uint uVar10;
  uint uVar11;
  undefined4 in_stack_ffffffffffffffac;
  int iVar12;
  wchar_t in_stack_ffffffffffffffb4;
  long local_38;
  char *local_18;
  
  in_RDI->archive_format = 0xc0000;
  if (in_RDI->archive_format_name == (char *)0x0) {
    in_RDI->archive_format_name = "CAB";
  }
  local_18 = (char *)__archive_read_ahead
                               ((archive_read *)
                                CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                                (size_t)in_stack_ffffffffffffff78,(ssize_t *)0x251357);
  if (local_18 == (char *)0x0) {
    wVar3 = truncated_error((archive_read *)0x25136c);
    return wVar3;
  }
  lVar1 = *(long *)in_RDI[0x15].archive_format_name;
  if (((*(char *)(lVar1 + 0x90) == '\0') && (*local_18 == 'M')) && (local_18[1] == 'Z')) {
    in_stack_ffffffffffffffb4 =
         cab_skip_sfx((archive_read *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8))
    ;
    if (in_stack_ffffffffffffffb4 < L'\xffffffec') {
      return in_stack_ffffffffffffffb4;
    }
    local_18 = (char *)__archive_read_ahead
                                 ((archive_read *)
                                  CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                                  (size_t)in_stack_ffffffffffffff78,(ssize_t *)0x2513f0);
    if (local_18 == (char *)0x0) {
      wVar3 = truncated_error((archive_read *)0x251405);
      return wVar3;
    }
  }
  *(undefined8 *)(lVar1 + 0x40) = 0;
  if (((*local_18 != 'M') || (local_18[1] != 'S')) || ((local_18[2] != 'C' || (local_18[3] != 'F')))
     ) {
    archive_set_error(in_RDI,0x54,"Couldn\'t find out CAB header");
    return L'\xffffffe2';
  }
  uVar4 = archive_le32dec(local_18 + 8);
  *(uint32_t *)(lVar1 + 0x48) = uVar4;
  uVar4 = archive_le32dec(local_18 + 0x10);
  *(uint32_t *)(lVar1 + 0x4c) = uVar4;
  *(char *)(lVar1 + 0x5b) = local_18[0x18];
  *(char *)(lVar1 + 0x5a) = local_18[0x19];
  uVar2 = archive_le16dec(local_18 + 0x1a);
  *(uint16_t *)(lVar1 + 0x50) = uVar2;
  if (*(short *)(lVar1 + 0x50) != 0) {
    uVar2 = archive_le16dec(local_18 + 0x1c);
    *(uint16_t *)(lVar1 + 0x52) = uVar2;
    if (*(short *)(lVar1 + 0x52) != 0) {
      uVar2 = archive_le16dec(local_18 + 0x1e);
      *(uint16_t *)(lVar1 + 0x54) = uVar2;
      uVar2 = archive_le16dec(local_18 + 0x20);
      *(uint16_t *)(lVar1 + 0x56) = uVar2;
      uVar2 = archive_le16dec(local_18 + 0x22);
      *(uint16_t *)(lVar1 + 0x58) = uVar2;
      local_38 = 0x24;
      if ((*(ushort *)(lVar1 + 0x54) & 4) == 0) {
        *(undefined1 *)(lVar1 + 0x5c) = 0;
      }
      else {
        in_stack_ffffffffffffffa2 = archive_le16dec(local_18 + 0x24);
        if (60000 < in_stack_ffffffffffffffa2) goto LAB_00251ec1;
        *(char *)(lVar1 + 0x5c) = local_18[0x26];
        *(char *)(lVar1 + 0x5d) = local_18[0x27];
        local_38 = (ulong)in_stack_ffffffffffffffa2 + 0x28;
      }
      if ((*(ushort *)(lVar1 + 0x54) & 1) != 0) {
        pvVar5 = __archive_read_ahead
                           ((archive_read *)
                            CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                            (size_t)in_stack_ffffffffffffff78,(ssize_t *)0x251639);
        if (pvVar5 == (void *)0x0) {
          wVar3 = truncated_error((archive_read *)0x25164e);
          return wVar3;
        }
        sVar6 = cab_strnlen((uchar *)((long)pvVar5 + local_38),0xff);
        if (sVar6 < 1) goto LAB_00251ec1;
        local_38 = sVar6 + 1 + local_38;
        pvVar5 = __archive_read_ahead
                           ((archive_read *)
                            CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                            (size_t)in_stack_ffffffffffffff78,(ssize_t *)0x2516ab);
        if (pvVar5 == (void *)0x0) {
          wVar3 = truncated_error((archive_read *)0x2516c0);
          return wVar3;
        }
        sVar6 = cab_strnlen((uchar *)((long)pvVar5 + local_38),0xff);
        if (sVar6 < 1) goto LAB_00251ec1;
        local_38 = sVar6 + 1 + local_38;
      }
      if ((*(ushort *)(lVar1 + 0x54) & 2) != 0) {
        pvVar5 = __archive_read_ahead
                           ((archive_read *)
                            CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                            (size_t)in_stack_ffffffffffffff78,(ssize_t *)0x251732);
        if (pvVar5 == (void *)0x0) {
          wVar3 = truncated_error((archive_read *)0x251747);
          return wVar3;
        }
        sVar6 = cab_strnlen((uchar *)((long)pvVar5 + local_38),0xff);
        if (sVar6 < 1) goto LAB_00251ec1;
        local_38 = sVar6 + 1 + local_38;
        pvVar5 = __archive_read_ahead
                           ((archive_read *)
                            CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                            (size_t)in_stack_ffffffffffffff78,(ssize_t *)0x2517a4);
        if (pvVar5 == (void *)0x0) {
          wVar3 = truncated_error((archive_read *)0x2517b9);
          return wVar3;
        }
        sVar6 = cab_strnlen((uchar *)((long)pvVar5 + local_38),0xff);
        if (sVar6 < 1) goto LAB_00251ec1;
        local_38 = sVar6 + 1 + local_38;
      }
      __archive_read_consume
                ((archive_read *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                 (int64_t)in_stack_ffffffffffffff78);
      *(long *)(lVar1 + 0x40) = local_38 + *(long *)(lVar1 + 0x40);
      local_38 = 0;
      pvVar5 = calloc((ulong)*(ushort *)(lVar1 + 0x50),0x60);
      *(void **)(lVar1 + 0x60) = pvVar5;
      if (*(long *)(lVar1 + 0x60) != 0) {
        local_18 = (char *)__archive_read_ahead
                                     ((archive_read *)
                                      CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                                      (size_t)in_stack_ffffffffffffff78,(ssize_t *)0x2518ac);
        if (local_18 == (char *)0x0) {
          wVar3 = truncated_error((archive_read *)0x2518c1);
          return wVar3;
        }
        uVar9 = 0;
        for (iVar12 = 0; iVar12 < (int)(uint)*(ushort *)(lVar1 + 0x50); iVar12 = iVar12 + 1) {
          in_stack_ffffffffffffff98 = (uint *)(*(long *)(lVar1 + 0x60) + (long)iVar12 * 0x60);
          uVar4 = archive_le32dec(local_18);
          *in_stack_ffffffffffffff98 = uVar4;
          uVar2 = archive_le16dec((void *)((long)local_18 + 4));
          *(uint16_t *)(in_stack_ffffffffffffff98 + 1) = uVar2;
          uVar2 = archive_le16dec((void *)((long)local_18 + 6));
          *(uint16_t *)((long)in_stack_ffffffffffffff98 + 6) = uVar2 & 0xf;
          uVar2 = archive_le16dec((void *)((long)local_18 + 6));
          *(uint16_t *)(in_stack_ffffffffffffff98 + 2) = uVar2 >> 8;
          if (*(ushort *)((long)in_stack_ffffffffffffff98 + 6) < 4) {
            *(char **)(in_stack_ffffffffffffff98 + 4) =
                 compression_name[*(ushort *)((long)in_stack_ffffffffffffff98 + 6)];
          }
          else {
            *(char **)(in_stack_ffffffffffffff98 + 4) = "UNKNOWN";
          }
          local_18 = (char *)((long)local_18 + 8);
          local_38 = local_38 + 8;
          if ((*(ushort *)(lVar1 + 0x54) & 4) != 0) {
            local_18 = (char *)((long)local_18 + (long)(int)(uint)*(byte *)(lVar1 + 0x5c));
            local_38 = (ulong)*(byte *)(lVar1 + 0x5c) + local_38;
          }
          if (*in_stack_ffffffffffffff98 <= uVar9) goto LAB_00251ec1;
          uVar9 = *in_stack_ffffffffffffff98;
          *(undefined1 *)(in_stack_ffffffffffffff98 + 0x17) = 0;
        }
        __archive_read_consume
                  ((archive_read *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                   (int64_t)in_stack_ffffffffffffff78);
        *(long *)(lVar1 + 0x40) = local_38 + *(long *)(lVar1 + 0x40);
        lVar7 = (ulong)*(uint *)(lVar1 + 0x4c) - *(long *)(lVar1 + 0x40);
        if (lVar7 < 0) {
          archive_set_error(in_RDI,-1,"Invalid offset of CFFILE %jd < %jd",
                            (ulong)*(uint *)(lVar1 + 0x4c),*(undefined8 *)(lVar1 + 0x40));
          return L'\xffffffe2';
        }
        if (lVar7 != 0) {
          __archive_read_consume
                    ((archive_read *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                     (int64_t)in_stack_ffffffffffffff78);
          *(long *)(lVar1 + 0x40) = lVar7 + *(long *)(lVar1 + 0x40);
        }
        pvVar5 = calloc((ulong)*(ushort *)(lVar1 + 0x52),0x30);
        *(void **)(lVar1 + 0x68) = pvVar5;
        if (*(long *)(lVar1 + 0x68) != 0) {
          uVar10 = 0xffffffff;
          iVar12 = 0;
          while( true ) {
            if ((int)(uint)*(ushort *)(lVar1 + 0x52) <= iVar12) {
              if ((*(short *)(lVar1 + 0x58) == 0) && ((*(ushort *)(lVar1 + 0x54) & 3) == 0)) {
                return L'\0';
              }
              archive_set_error(in_RDI,0x54,"Multivolume cabinet file is unsupported");
              return L'\xffffffec';
            }
            n = (uint *)(*(long *)(lVar1 + 0x68) + (long)iVar12 * 0x30);
            pvVar5 = __archive_read_ahead
                               ((archive_read *)
                                CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                                (size_t)in_stack_ffffffffffffff78,(ssize_t *)0x251b6f);
            if (pvVar5 == (void *)0x0) {
              wVar3 = truncated_error((archive_read *)0x251b84);
              return wVar3;
            }
            uVar4 = archive_le32dec(pvVar5);
            *n = uVar4;
            uVar4 = archive_le32dec((void *)((long)pvVar5 + 4));
            n[1] = uVar4;
            uVar2 = archive_le16dec((void *)((long)pvVar5 + 8));
            *(uint16_t *)(n + 4) = uVar2;
            tVar8 = cab_dos_time((uchar *)CONCAT44(in_stack_ffffffffffffffb4,iVar12));
            *(time_t *)(n + 2) = tVar8;
            uVar2 = archive_le16dec((void *)((long)pvVar5 + 0xe));
            *(char *)((long)n + 0x12) = (char)uVar2;
            __archive_read_consume
                      ((archive_read *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80)
                       ,(int64_t)in_stack_ffffffffffffff78);
            *(long *)(lVar1 + 0x40) = *(long *)(lVar1 + 0x40) + 0x10;
            p_00 = (uchar *)cab_read_ahead_remaining
                                      (in_stack_ffffffffffffff88,
                                       CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80)
                                       ,in_stack_ffffffffffffff78);
            if (p_00 == (uchar *)0x0) {
              wVar3 = truncated_error((archive_read *)0x251c50);
              return wVar3;
            }
            sVar6 = cab_strnlen(p_00,(size_t)((long)&in_stack_ffffffffffffff88[-1].
                                                     cleanup_archive_extract + 7));
            if (sVar6 < 1) break;
            n[6] = 0;
            n[7] = 0;
            n[8] = 0;
            n[9] = 0;
            n[10] = 0;
            n[0xb] = 0;
            n[8] = 0;
            n[9] = 0;
            archive_strncat((archive_string *)
                            CONCAT44(uVar9,CONCAT22(in_stack_ffffffffffffffa2,
                                                    in_stack_ffffffffffffffa0)),
                            in_stack_ffffffffffffff98,(size_t)n);
            __archive_read_consume
                      ((archive_read *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80)
                       ,(int64_t)in_stack_ffffffffffffff78);
            *(ssize_t *)(lVar1 + 0x40) = sVar6 + 1 + *(long *)(lVar1 + 0x40);
            if ((0x7fff8000 < *n) || (0x7fff8000 < (ulong)n[1] + (ulong)*n)) break;
            in_stack_ffffffffffffff84 = (uint)(ushort)n[4];
            if (in_stack_ffffffffffffff84 == 0xfffd) {
LAB_00251d97:
              if (iVar12 != 0) break;
              uVar9 = n[1];
              uVar11 = 0;
              uVar10 = 0;
            }
            else {
              uVar11 = uVar10;
              if (in_stack_ffffffffffffff84 == 0xfffe) {
                if (iVar12 != *(ushort *)(lVar1 + 0x52) - 1) break;
                uVar10 = *(ushort *)(lVar1 + 0x50) - 1;
              }
              else {
                if (in_stack_ffffffffffffff84 == 0xffff) {
                  if (*(short *)(lVar1 + 0x52) == 1) goto LAB_00251d97;
                  break;
                }
                if (*(ushort *)(lVar1 + 0x50) <= (ushort)n[4]) break;
                uVar10 = (uint)(ushort)n[4];
              }
            }
            if ((int)uVar10 < (int)uVar11) break;
            if (uVar10 != uVar11) {
              uVar9 = 0;
            }
            if ((uVar9 != n[1]) ||
               ((uVar9 = *n + uVar9, *n != 0 &&
                (*(short *)(*(long *)(lVar1 + 0x60) + (long)(int)uVar10 * 0x60 + 4) == 0)))) break;
            iVar12 = iVar12 + 1;
          }
          goto LAB_00251ec1;
        }
      }
      archive_set_error(in_RDI,0xc,"Can\'t allocate memory for CAB data");
      return L'\xffffffe2';
    }
  }
LAB_00251ec1:
  archive_set_error(in_RDI,0x54,"Invalid CAB header");
  return L'\xffffffe2';
}

Assistant:

static int
cab_read_header(struct archive_read *a)
{
	const unsigned char *p;
	struct cab *cab;
	struct cfheader *hd;
	size_t bytes, used;
	ssize_t len;
	int64_t skip;
	int err, i;
	int cur_folder, prev_folder;
	uint32_t offset32;
	
	a->archive.archive_format = ARCHIVE_FORMAT_CAB;
	if (a->archive.archive_format_name == NULL)
		a->archive.archive_format_name = "CAB";

	if ((p = __archive_read_ahead(a, 42, NULL)) == NULL)
		return (truncated_error(a));

	cab = (struct cab *)(a->format->data);
	if (cab->found_header == 0 &&
	    p[0] == 'M' && p[1] == 'Z') {
		/* This is an executable?  Must be self-extracting... 	*/
		err = cab_skip_sfx(a);
		if (err < ARCHIVE_WARN)
			return (err);

		if ((p = __archive_read_ahead(a, sizeof(*p), NULL)) == NULL)
			return (truncated_error(a));
	}

	cab->cab_offset = 0;
	/*
	 * Read CFHEADER.
	 */
	hd = &cab->cfheader;
	if (p[CFHEADER_signature+0] != 'M' || p[CFHEADER_signature+1] != 'S' ||
	    p[CFHEADER_signature+2] != 'C' || p[CFHEADER_signature+3] != 'F') {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Couldn't find out CAB header");
		return (ARCHIVE_FATAL);
	}
	hd->total_bytes = archive_le32dec(p + CFHEADER_cbCabinet);
	hd->files_offset = archive_le32dec(p + CFHEADER_coffFiles);
	hd->minor = p[CFHEADER_versionMinor];
	hd->major = p[CFHEADER_versionMajor];
	hd->folder_count = archive_le16dec(p + CFHEADER_cFolders);
	if (hd->folder_count == 0)
		goto invalid;
	hd->file_count = archive_le16dec(p + CFHEADER_cFiles);
	if (hd->file_count == 0)
		goto invalid;
	hd->flags = archive_le16dec(p + CFHEADER_flags);
	hd->setid = archive_le16dec(p + CFHEADER_setID);
	hd->cabinet = archive_le16dec(p + CFHEADER_iCabinet);
	used = CFHEADER_iCabinet + 2;
	if (hd->flags & RESERVE_PRESENT) {
		uint16_t cfheader;
		cfheader = archive_le16dec(p + CFHEADER_cbCFHeader);
		if (cfheader > 60000U)
			goto invalid;
		hd->cffolder = p[CFHEADER_cbCFFolder];
		hd->cfdata = p[CFHEADER_cbCFData];
		used += 4;/* cbCFHeader, cbCFFolder and cbCFData */
		used += cfheader;/* abReserve */
	} else
		hd->cffolder = 0;/* Avoid compiling warning. */
	if (hd->flags & PREV_CABINET) {
		/* How many bytes are used for szCabinetPrev. */
		if ((p = __archive_read_ahead(a, used+256, NULL)) == NULL)
			return (truncated_error(a));
		if ((len = cab_strnlen(p + used, 255)) <= 0)
			goto invalid;
		used += len + 1;
		/* How many bytes are used for szDiskPrev. */
		if ((p = __archive_read_ahead(a, used+256, NULL)) == NULL)
			return (truncated_error(a));
		if ((len = cab_strnlen(p + used, 255)) <= 0)
			goto invalid;
		used += len + 1;
	}
	if (hd->flags & NEXT_CABINET) {
		/* How many bytes are used for szCabinetNext. */
		if ((p = __archive_read_ahead(a, used+256, NULL)) == NULL)
			return (truncated_error(a));
		if ((len = cab_strnlen(p + used, 255)) <= 0)
			goto invalid;
		used += len + 1;
		/* How many bytes are used for szDiskNext. */
		if ((p = __archive_read_ahead(a, used+256, NULL)) == NULL)
			return (truncated_error(a));
		if ((len = cab_strnlen(p + used, 255)) <= 0)
			goto invalid;
		used += len + 1;
	}
	__archive_read_consume(a, used);
	cab->cab_offset += used;
	used = 0;

	/*
	 * Read CFFOLDER.
	 */
	hd->folder_array = (struct cffolder *)calloc(
	    hd->folder_count, sizeof(struct cffolder));
	if (hd->folder_array == NULL)
		goto nomem;
	
	bytes = 8;
	if (hd->flags & RESERVE_PRESENT)
		bytes += hd->cffolder;
	bytes *= hd->folder_count;
	if ((p = __archive_read_ahead(a, bytes, NULL)) == NULL)
		return (truncated_error(a));
	offset32 = 0;
	for (i = 0; i < hd->folder_count; i++) {
		struct cffolder *folder = &(hd->folder_array[i]);
		folder->cfdata_offset_in_cab =
		    archive_le32dec(p + CFFOLDER_coffCabStart);
		folder->cfdata_count = archive_le16dec(p+CFFOLDER_cCFData);
		folder->comptype =
		    archive_le16dec(p+CFFOLDER_typeCompress) & 0x0F;
		folder->compdata =
		    archive_le16dec(p+CFFOLDER_typeCompress) >> 8;
		/* Get a compression name. */
		if (folder->comptype <
		    sizeof(compression_name) / sizeof(compression_name[0]))
			folder->compname = compression_name[folder->comptype];
		else
			folder->compname = "UNKNOWN";
		p += 8;
		used += 8;
		if (hd->flags & RESERVE_PRESENT) {
			p += hd->cffolder;/* abReserve */
			used += hd->cffolder;
		}
		/*
		 * Sanity check if each data is acceptable.
		 */
		if (offset32 >= folder->cfdata_offset_in_cab)
			goto invalid;
		offset32 = folder->cfdata_offset_in_cab;

		/* Set a request to initialize zlib for the CFDATA of
		 * this folder. */
		folder->decompress_init = 0;
	}
	__archive_read_consume(a, used);
	cab->cab_offset += used;

	/*
	 * Read CFFILE.
	 */
	/* Seek read pointer to the offset of CFFILE if needed. */
	skip = (int64_t)hd->files_offset - cab->cab_offset;
	if (skip <  0) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
		    "Invalid offset of CFFILE %jd < %jd",
		    (intmax_t)hd->files_offset, (intmax_t)cab->cab_offset);
		return (ARCHIVE_FATAL);
	}
	if (skip) {
		__archive_read_consume(a, skip);
		cab->cab_offset += skip;
	}
	/* Allocate memory for CFDATA */
	hd->file_array = (struct cffile *)calloc(
	    hd->file_count, sizeof(struct cffile));
	if (hd->file_array == NULL)
		goto nomem;

	prev_folder = -1;
	for (i = 0; i < hd->file_count; i++) {
		struct cffile *file = &(hd->file_array[i]);
		ssize_t avail;

		if ((p = __archive_read_ahead(a, 16, NULL)) == NULL)
			return (truncated_error(a));
		file->uncompressed_size = archive_le32dec(p + CFFILE_cbFile);
		file->offset = archive_le32dec(p + CFFILE_uoffFolderStart);
		file->folder = archive_le16dec(p + CFFILE_iFolder);
		file->mtime = cab_dos_time(p + CFFILE_date_time);
		file->attr = (uint8_t)archive_le16dec(p + CFFILE_attribs);
		__archive_read_consume(a, 16);

		cab->cab_offset += 16;
		if ((p = cab_read_ahead_remaining(a, 256, &avail)) == NULL)
			return (truncated_error(a));
		if ((len = cab_strnlen(p, avail-1)) <= 0)
			goto invalid;

		/* Copy a pathname.  */
		archive_string_init(&(file->pathname));
		archive_strncpy(&(file->pathname), p, len);
		__archive_read_consume(a, len + 1);
		cab->cab_offset += len + 1;

		/*
		 * Sanity check if each data is acceptable.
		 */
		if (file->uncompressed_size > 0x7FFF8000)
			goto invalid;/* Too large */
		if ((int64_t)file->offset + (int64_t)file->uncompressed_size
		    > ARCHIVE_LITERAL_LL(0x7FFF8000))
			goto invalid;/* Too large */
		switch (file->folder) {
		case iFoldCONTINUED_TO_NEXT:
			/* This must be last file in a folder. */
			if (i != hd->file_count -1)
				goto invalid;
			cur_folder = hd->folder_count -1;
			break;
		case iFoldCONTINUED_PREV_AND_NEXT:
			/* This must be only one file in a folder. */
			if (hd->file_count != 1)
				goto invalid;
			/* FALL THROUGH */
		case iFoldCONTINUED_FROM_PREV:
			/* This must be first file in a folder. */
			if (i != 0)
				goto invalid;
			prev_folder = cur_folder = 0;
			offset32 = file->offset;
			break;
		default:
			if (file->folder >= hd->folder_count)
				goto invalid;
			cur_folder = file->folder;
			break;
		}
		/* Dot not back track. */
		if (cur_folder < prev_folder)
			goto invalid;
		if (cur_folder != prev_folder)
			offset32 = 0;
		prev_folder = cur_folder;

		/* Make sure there are not any blanks from last file
		 * contents. */
		if (offset32 != file->offset)
			goto invalid;
		offset32 += file->uncompressed_size;

		/* CFDATA is available for file contents. */
		if (file->uncompressed_size > 0 &&
		    hd->folder_array[cur_folder].cfdata_count == 0)
			goto invalid;
	}

	if (hd->cabinet != 0 || hd->flags & (PREV_CABINET | NEXT_CABINET)) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Multivolume cabinet file is unsupported");
		return (ARCHIVE_WARN);
	}
	return (ARCHIVE_OK);
invalid:
	archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
	    "Invalid CAB header");
	return (ARCHIVE_FATAL);
nomem:
	archive_set_error(&a->archive, ENOMEM,
	    "Can't allocate memory for CAB data");
	return (ARCHIVE_FATAL);
}